

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void js_promise_resolve_function_finalizer(JSRuntime *rt,JSValue val)

{
  int iVar1;
  JSValue *pJVar2;
  int *piVar3;
  JSValue v;
  
  pJVar2 = *(JSValue **)((long)val.u.ptr + 0x30);
  if (pJVar2 != (JSValue *)0x0) {
    piVar3 = (int *)pJVar2[1].u.ptr;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      (*(rt->mf).js_free)(&rt->malloc_state,piVar3);
    }
    v = *pJVar2;
    if ((0xfffffff4 < (uint)pJVar2->tag) &&
       (iVar1 = *(pJVar2->u).ptr, *(int *)(pJVar2->u).ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(rt,v);
    }
    (*(rt->mf).js_free)(&rt->malloc_state,pJVar2);
    return;
  }
  return;
}

Assistant:

static void js_promise_resolve_function_finalizer(JSRuntime *rt, JSValue val)
{
    JSPromiseFunctionData *s = JS_VALUE_GET_OBJ(val)->u.promise_function_data;
    if (s) {
        js_promise_resolve_function_free_resolved(rt, s->presolved);
        JS_FreeValueRT(rt, s->promise);
        js_free_rt(rt, s);
    }
}